

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Compiler::processVariable
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *line)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool bVar2;
  uint uVar3;
  const_reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  size_type sVar7;
  iterator __first;
  iterator __last;
  reference pvVar8;
  ulong uVar9;
  unsigned_long_long uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  Variable *pVVar12;
  string local_3d8 [32];
  string local_3b8 [8];
  string arraySize_1;
  string local_398 [8];
  string arrayName_1;
  undefined1 local_370 [4];
  uint stackSizeAfter_1;
  uint local_34c;
  string local_348 [4];
  uint stackSizePrior_1;
  Variable *local_328;
  Variable *var;
  __cxx11 local_318 [32];
  char local_2f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8 [39];
  undefined1 local_2b1;
  __cxx11 local_2b0 [32];
  __cxx11 local_290 [32];
  char local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [36];
  uint local_22c;
  string local_228 [4];
  uint arraySizeCasted;
  string local_208 [8];
  string arraySize;
  string local_1e8 [8];
  string arrayName;
  string local_1c0 [4];
  uint stackSizeAfter;
  uint local_1a0;
  uint local_19c;
  uint stackSizePrior;
  uint a;
  string args;
  Parser local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments;
  DataType local_f4;
  undefined1 local_f0 [4];
  DataType type;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [48];
  undefined1 local_80 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [36];
  DataType local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  DataType possibleType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *line_local;
  Compiler *this_local;
  
  pvStack_18 = line;
  line_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](line,0);
  local_1c = stringToDataType(pvVar4);
  if (local_1c == UNKNOWN) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_18,0);
    bVar2 = std::operator!=(pvVar4,"auto");
    if (bVar2) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_18,1);
      bVar2 = std::operator==(pvVar4,"=");
      pvVar1 = pvStack_18;
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size(pvStack_18);
        Parser::combineArguments
                  ((Parser *)local_80,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&this->parser,(uint)pvVar1,2);
        std::operator+(local_80 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(");
        std::operator+(local_40,local_80 + 0x20);
        evaluateBracket(this,local_40);
        std::__cxx11::string::~string((string *)local_40);
        std::__cxx11::string::~string((string *)(local_80 + 0x20));
        std::__cxx11::string::~string((string *)local_80);
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvStack_18,0);
        InstructionGenerator::genCloneTop(&this->igen,pvVar4);
        pvVar1 = pvStack_18;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size(pvStack_18);
        Parser::combineArguments
                  ((Parser *)local_f0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&this->parser,(uint)pvVar1,2);
        std::operator+((char *)local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(");
        std::operator+(local_b0,(char *)local_d0);
        evaluateBracket(this,local_b0);
        std::__cxx11::string::~string((string *)local_b0);
        std::__cxx11::string::~string(local_d0);
        std::__cxx11::string::~string((string *)local_f0);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvStack_18,1);
        bVar2 = std::operator==(pvVar4,"*=");
        if (bVar2) {
          InstructionGenerator::genMathMultiply(&this->igen,2);
        }
        else {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvStack_18,1);
          bVar2 = std::operator==(pvVar4,"/=");
          if (bVar2) {
            InstructionGenerator::genMathDivide(&this->igen,2);
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](pvStack_18,1);
            bVar2 = std::operator==(pvVar4,"%=");
            if (bVar2) {
              InstructionGenerator::genMathModulus(&this->igen,2);
            }
            else {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](pvStack_18,1);
              bVar2 = std::operator==(pvVar4,"+=");
              if (bVar2) {
                InstructionGenerator::genMathAdd(&this->igen,2);
              }
              else {
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](pvStack_18,1);
                bVar2 = std::operator==(pvVar4,"-=");
                if (bVar2) {
                  InstructionGenerator::genMathSubtract(&this->igen,2);
                }
                else {
                  pvVar4 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](pvStack_18,1);
                  bVar2 = std::operator==(pvVar4,"@=");
                  if (bVar2) {
                    InstructionGenerator::genConcentrateStrings(&this->igen,2);
                  }
                }
              }
            }
          }
        }
      }
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_18,0);
      InstructionGenerator::genSetVariable(&this->igen,pvVar4);
      return;
    }
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](pvStack_18,0);
  local_f4 = stringToDataType(pvVar4);
  bVar2 = std::vector<Scope,_std::allocator<Scope>_>::empty(&this->openScopeStack);
  if ((bVar2) ||
     (pvVar5 = std::vector<Scope,_std::allocator<Scope>_>::back(&this->openScopeStack),
     pvVar5->type != CLASS)) {
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvStack_18);
    if (sVar7 < 3) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_18,1);
      bVar2 = Parser::isArrayDefinition(&this->parser,pvVar4);
      if (bVar2) {
        std::__cxx11::string::string(local_398);
        std::__cxx11::string::string(local_3b8);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvStack_18,1);
        std::__cxx11::string::string(local_3d8,(string *)pvVar4);
        Parser::splitArrayDefinition
                  (&this->parser,(string *)local_3d8,(string *)local_398,(string *)local_3b8);
        std::__cxx11::string::~string(local_3d8);
        InstructionGenerator::genCreateArray
                  (&this->igen,(string *)local_398,(string *)local_3b8,local_1c);
        std::__cxx11::string::~string(local_3b8);
        std::__cxx11::string::~string(local_398);
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvStack_18,1);
        InstructionGenerator::genCreateDefaultValue(&this->igen,pvVar4,local_1c);
      }
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_18,1);
      bVar2 = Parser::isArrayDefinition(&this->parser,pvVar4);
      pvVar1 = pvStack_18;
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size(pvStack_18);
        Parser::combineArguments
                  (&local_168,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&this->parser,(uint)pvVar1,3);
        Parser::extractBracketArguments(&local_168.spacingTokens,&this->parser,(string *)&local_168)
        ;
        std::__cxx11::string::~string((string *)&local_168);
        local_130 = &local_168.spacingTokens;
        __first = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin(local_130);
        __last = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(local_130);
        std::
        reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__first._M_current,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__last._M_current);
        std::__cxx11::string::string((string *)&stackSizePrior);
        for (local_19c = 0; uVar9 = (ulong)local_19c,
            sVar7 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(local_130), uVar9 < sVar7; local_19c = local_19c + 1) {
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_130,(ulong)local_19c);
          std::__cxx11::string::operator+=((string *)&stackSizePrior,(string *)pvVar8);
          uVar9 = (ulong)local_19c;
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_130);
          if (uVar9 != sVar7 - 1) {
            std::__cxx11::string::operator+=((string *)&stackSizePrior,", ");
          }
        }
        local_1a0 = VirtualStack::getStackSize(&(this->igen).super_VirtualStack);
        std::__cxx11::string::string(local_1c0,(string *)&stackSizePrior);
        evaluateBracket(this,(string *)local_1c0);
        std::__cxx11::string::~string(local_1c0);
        uVar3 = VirtualStack::getStackSize(&(this->igen).super_VirtualStack);
        std::__cxx11::string::string(local_1e8);
        std::__cxx11::string::string(local_208);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvStack_18,1);
        std::__cxx11::string::string(local_228,(string *)pvVar4);
        Parser::splitArrayDefinition
                  (&this->parser,(string *)local_228,(string *)local_1e8,(string *)local_208);
        std::__cxx11::string::~string(local_228);
        local_22c = 0;
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          uVar10 = std::__cxx11::stoull((string *)local_208,(size_t *)0x0,10);
          local_22c = (uint)uVar10;
        }
        else {
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_130);
          local_22c = (uint)sVar7;
        }
        uVar9 = (ulong)local_22c;
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_130);
        if (uVar9 < sVar7) {
          local_2b1 = 1;
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
          std::__cxx11::to_string(local_290,local_22c);
          std::operator+(local_270,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Array initialiser contains too many elements for the array to hold. Array size: "
                        );
          std::operator+(local_250,local_270);
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_130);
          std::__cxx11::to_string(local_2b0,sVar7);
          std::operator+(pbVar11,local_250);
          local_2b1 = 0;
          __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        if (local_22c != uVar3 - local_1a0) {
          var._7_1_ = 1;
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
          std::__cxx11::to_string(local_318,uVar3 - local_1a0);
          std::operator+(local_2f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Invalid array initialiser arguments. Got ");
          std::operator+(local_2d8,local_2f8);
          std::operator+(pbVar11,local_2d8);
          var._7_1_ = 0;
          __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        uVar3 = VirtualStack::getStackSize(&(this->igen).super_VirtualStack);
        VirtualStack::renameVariable
                  (&(this->igen).super_VirtualStack,uVar3 - local_22c,(string *)local_1e8);
        std::__cxx11::string::string(local_348,local_1e8);
        uVar3 = VirtualStack::isVariable(&(this->igen).super_VirtualStack,(string *)local_348);
        pVVar12 = VirtualStack::getVariable(&(this->igen).super_VirtualStack,uVar3);
        std::__cxx11::string::~string(local_348);
        pVVar12->arrayLength = local_22c;
        pVVar12->isArray = true;
        local_328 = pVVar12;
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string(local_1e8);
        std::__cxx11::string::~string((string *)&stackSizePrior);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_168.spacingTokens);
      }
      else {
        local_34c = VirtualStack::getStackSize(&(this->igen).super_VirtualStack);
        pvVar1 = pvStack_18;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size(pvStack_18);
        Parser::combineArguments
                  ((Parser *)local_370,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&this->parser,(uint)pvVar1,3);
        evaluateBracket(this,(string *)local_370);
        std::__cxx11::string::~string((string *)local_370);
        VirtualStack::getStackSize(&(this->igen).super_VirtualStack);
        uVar3 = VirtualStack::getStackSize(&(this->igen).super_VirtualStack);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvStack_18,1);
        VirtualStack::renameVariable(&(this->igen).super_VirtualStack,uVar3 - 1,pvVar4);
      }
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"\nVar in class: ");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_18,1);
    std::operator<<(poVar6,(string *)pvVar4);
    pvVar5 = std::vector<Scope,_std::allocator<Scope>_>::back(&this->pastScopes);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_18,1);
    Variable::Variable((Variable *)&arguments,pvVar4,local_f4);
    std::vector<Variable,_std::allocator<Variable>_>::emplace_back<Variable>
              (&pvVar5->childDataMembers,(Variable *)&arguments);
    Variable::~Variable((Variable *)&arguments);
  }
  return;
}

Assistant:

void Compiler::processVariable(const std::vector<std::string>& line) //things like "int a = 20"
{
    DataType possibleType = stringToDataType(line[0]);
    if(possibleType == DataType::UNKNOWN && line[0] != "auto") //If we're not creating a new variable (eg a = 20)
    {
        if(line[1] == "=") //If it's a set operation
        {
            //Evaluate the bracket containing what the variable should be set to
            evaluateBracket("(" + parser.combineArguments(line, 2, line.size() - 2) + ")");
        }
        else //Else if it's a math operation
        {
            //First move the variable data that we're operating on to the top of the stack
            igen.genCloneTop(line[0]);

            //Evaluate the bracket containing what the variable should be set to
            evaluateBracket("(" + parser.combineArguments(line, 2, line.size() - 2) + ")");

            //Do different things depending on the assignment operator
            if(line[1] == "*=")
            {
                igen.genMathMultiply(2);
            }
            else if(line[1] == "/=")
            {
                igen.genMathDivide(2);
            }
            else if(line[1] == "%=")
            {
                //Divide the last two things on the stack (the bracket and the variable)
                igen.genMathModulus(2);
            }
            else if(line[1] == "+=")
            {
                igen.genMathAdd(2);
            }
            else if(line[1] == "-=")
            {
                igen.genMathSubtract(2);
            }
            else if(line[1] == "@=")
            {
                igen.genConcentrateStrings(2);
            }
        }

        //Set the variable to the last thing on the stack
        igen.genSetVariable(line[0]);
    }
    else //If we're creating a new variable (eg int a = 20)
    {
        //Convert its data type from string to enum
        DataType type = stringToDataType(line[0]);

        if(!openScopeStack.empty() && openScopeStack.back().type == Scope::CLASS) //We're defining class members, so don't actually create them. Just register to the class.
        {
            std::cout << "\nVar in class: " << line[1];
            //NOTE TO SELF: ADD BRACKET INITIALISATION EVALUATION
            pastScopes.back().childDataMembers.emplace_back(Variable(line[1], type));
        }
        else //If we're not in a class, create the variables immediately
        {
            if(line.size() > 2) //If there's a value provided (int a = 20)
            {
                if(parser.isArrayDefinition(line[1])) //Check if it's an array definition
                {
                    //Flip argument list for left->right parsing
                    std::vector<std::string> &&arguments = parser.extractBracketArguments(parser.combineArguments(line, 3, line.size() - 3));
                    std::reverse(arguments.begin(), arguments.end());
                    std::string args;
                    for(unsigned int a = 0; a < arguments.size(); a++)
                    {
                        args += arguments[a];
                        if(a != arguments.size()-1)
                            args += ", ";
                    }

                    //Evaluate value to set it to and name the variable
                    unsigned int stackSizePrior = igen.getStackSize();

                    evaluateBracket(args);
                    unsigned int stackSizeAfter = igen.getStackSize();

                    //Split array definition into name and size
                    std::string arrayName;
                    std::string arraySize;
                    parser.splitArrayDefinition(line[1], arrayName, arraySize);

                    //Find how large to make it. Pick the size specified in the brackets if it's there, otherwise the number of elements in the initialiser list
                    unsigned int arraySizeCasted = 0;
                    if(!arraySize.empty())
                        arraySizeCasted = std::stoull(arraySize);
                    else
                        arraySizeCasted = (unsigned int)arguments.size();

                    //Check that the number of arguments in the initialiser list is smaller than the array size
                    if(arraySizeCasted < arguments.size())
                    {
                        throw std::string("Array initialiser contains too many elements for the array to hold. Array size: " + std::to_string(arraySizeCasted) + ". List size: " + std::to_string(arguments.size()));
                    }

                    if(arraySizeCasted != stackSizeAfter - stackSizePrior)
                    {
                        throw std::string("Invalid array initialiser arguments. Got " + std::to_string(stackSizeAfter - stackSizePrior) + ", expected " + arraySize);
                    }

                    //Name the created variables compiler side
                    igen.renameVariable(igen.getStackSize() - arraySizeCasted, arrayName);
                    Variable &var = igen.getVariable(igen.isVariable(arrayName));
                    var.arrayLength = arraySizeCasted;
                    var.isArray = true;
                }
                else
                {
                    //Evaluate value to set it to and name the variable
                    unsigned int stackSizePrior = igen.getStackSize();
                    evaluateBracket(parser.combineArguments(line, 3, line.size() - 3));
                    unsigned int stackSizeAfter = igen.getStackSize();

                    //Rename variable compiler side
                    igen.renameVariable(igen.getStackSize()-1, line[1]);
                }
            }
            else //Else no default value provided (int a)
            {
                if(parser.isArrayDefinition(line[1])) //Check if it's an array definition
                {
                    //Split array definition into name and size
                    std::string arrayName;
                    std::string arraySize;
                    parser.splitArrayDefinition(line[1], arrayName, arraySize);

                    //Create the array
                    igen.genCreateArray(arrayName, arraySize, possibleType);
                }
                else
                {
                    igen.genCreateDefaultValue(line[1], possibleType);
                }
            }
        }
    }
    return;
}